

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.h
# Opt level: O2

void __thiscall dynamicgraph::TimeDependency<int>::~TimeDependency(TimeDependency<int> *this)

{
  this->_vptr_TimeDependency = (_func_int **)&PTR__TimeDependency_001157a0;
  std::__cxx11::
  _List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::_M_clear(&(this->dependencies).
              super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
            );
  return;
}

Assistant:

virtual ~TimeDependency() {}